

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeFactory.cpp
# Opt level: O1

Executable * ExeFactory::build(AbstractByteBuffer *buf,exe_type type)

{
  mapped_type pEVar1;
  int iVar2;
  mapped_type *ppEVar3;
  undefined4 extraout_var;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  exe_type local_c;
  
  local_c = type;
  init((EVP_PKEY_CTX *)buf);
  p_Var5 = &builders._M_t._M_impl.super__Rb_tree_header._M_header;
  if (builders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var5 = &builders._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var4 = builders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if ((int)local_c <= (int)p_Var4[1]._M_color) {
        p_Var5 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < (int)local_c];
    } while (p_Var4 != (_Base_ptr)0x0);
  }
  if (((_Rb_tree_header *)p_Var5 != &builders._M_t._M_impl.super__Rb_tree_header) &&
     ((int)p_Var5[1]._M_color <= (int)local_c)) {
    ppEVar3 = std::
              map<ExeFactory::exe_type,_ExeBuilder_*,_std::less<ExeFactory::exe_type>,_std::allocator<std::pair<const_ExeFactory::exe_type,_ExeBuilder_*>_>_>
              ::operator[](&builders,&local_c);
    pEVar1 = *ppEVar3;
    if (pEVar1 != (mapped_type)0x0) {
      iVar2 = (*pEVar1->_vptr_ExeBuilder[3])(pEVar1,buf);
      return (Executable *)CONCAT44(extraout_var,iVar2);
    }
  }
  return (Executable *)0x0;
}

Assistant:

Executable* ExeFactory::build(AbstractByteBuffer *buf, exe_type type)
{
    ExeFactory::init(); //ensue that the builders are initialized

    if (builders.find(type) == builders.end()) {
        return NULL;
    }
    ExeBuilder* builder = builders[type];
    if (!builder) return NULL;

    return builder->build(buf);
}